

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O3

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  IRBuilder *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  long lVar3;
  int extraout_EAX;
  BasicBlock *bb;
  BasicBlock *target;
  BasicBlock *falseBlock;
  undefined4 in_register_00000034;
  string local_58;
  long local_38;
  
  local_38 = CONCAT44(in_register_00000034,__fd);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"while.body","");
  this_00 = &this->super_IRBuilder;
  bb = IRBuilder::createBlock(this_00,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"while.cond","");
  target = IRBuilder::createBlock(this_00,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"while.done","");
  falseBlock = IRBuilder::createBlock(this_00,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  IRBuilder::createBr(this_00,target);
  IRBuilder::setInsertPoint(this_00,bb);
  lVar3 = local_38;
  plVar2 = *(long **)(local_38 + 0x48);
  if (plVar2 == (long *)0x0) {
    this->result_ = (Value *)0x0;
  }
  else {
    (**(code **)(*plVar2 + 0x10))(plVar2,this);
  }
  IRBuilder::createBr(this_00,target);
  IRBuilder::setInsertPoint(this_00,target);
  (**(code **)(**(long **)(lVar3 + 0x40) + 0x10))(*(long **)(lVar3 + 0x40),this);
  IRBuilder::createCondBr(this_00,this->result_,bb,falseBlock);
  IRBuilder::setInsertPoint(this_00,falseBlock);
  return extraout_EAX;
}

Assistant:

void IRGenerator::accept(WhileStmt& whileStmt) {
  BasicBlock* bodyBlock = createBlock("while.body");
  BasicBlock* condBlock = createBlock("while.cond");
  BasicBlock* doneBlock = createBlock("while.done");

  createBr(condBlock);

  setInsertPoint(bodyBlock);
  codegen(whileStmt.bodyStmt());
  createBr(condBlock);

  setInsertPoint(condBlock);
  Value* cond = codegen(whileStmt.condition());
  createCondBr(cond, bodyBlock, doneBlock);

  setInsertPoint(doneBlock);
}